

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFindFile.cpp
# Opt level: O0

bool CascFindNextFile(HANDLE hFind,PCASC_FIND_DATA pFindData)

{
  TCascSearch *pSearch_00;
  TCascSearch *pSearch;
  PCASC_FIND_DATA pFindData_local;
  HANDLE hFind_local;
  
  pSearch_00 = IsValidSearchHandle(hFind);
  if ((pSearch_00 == (TCascSearch *)0x0) || (pFindData == (PCASC_FIND_DATA)0x0)) {
    SetLastError(0x16);
    hFind_local._7_1_ = false;
  }
  else {
    hFind_local._7_1_ = DoStorageSearch(pSearch_00,pFindData);
  }
  return hFind_local._7_1_;
}

Assistant:

bool WINAPI CascFindNextFile(
    HANDLE hFind,
    PCASC_FIND_DATA pFindData)
{
    TCascSearch * pSearch;

    pSearch = IsValidSearchHandle(hFind);
    if(pSearch == NULL || pFindData == NULL)
    {
        SetLastError(ERROR_INVALID_PARAMETER);
        return false;
    }

    // Perform search
    return DoStorageSearch(pSearch, pFindData);
}